

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O0

error_or<int> *
pstore::file::file_handle::close_noex(error_or<int> *__return_storage_ptr__,oshandle file)

{
  int iVar1;
  int *piVar2;
  error_code eVar3;
  errno_erc local_2c;
  uint local_28;
  error_category *local_20;
  oshandle local_14;
  error_or<int> *peStack_10;
  oshandle file_local;
  
  local_14 = file;
  peStack_10 = __return_storage_ptr__;
  if ((file != -1) && (iVar1 = ::close(file), iVar1 == -1)) {
    piVar2 = __errno_location();
    errno_erc::errno_erc(&local_2c,*piVar2);
    eVar3 = make_error_code(local_2c);
    local_28 = eVar3._M_value;
    eVar3._4_4_ = 0;
    eVar3._M_value = local_28;
    local_20 = eVar3._M_cat;
    error_or<int>::error_or(__return_storage_ptr__,eVar3);
    return __return_storage_ptr__;
  }
  error_or<int>::error_or<int_const&>(__return_storage_ptr__,&invalid_oshandle);
  return __return_storage_ptr__;
}

Assistant:

auto file_handle::close_noex (oshandle const file) -> error_or<oshandle> {
            if (file != invalid_oshandle && ::close (file) == -1) {
                return error_or<oshandle>{make_error_code (pstore::errno_erc (errno))};
            }
            return error_or<oshandle>{in_place, invalid_oshandle};
        }